

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsHeaderStartSong(uint arg_count,long *arg_array)

{
  if (arg_count == 0) {
    __assert_fail("arg_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x177,"void Macro_smpsHeaderStartSong(unsigned int, long *)");
  }
  song_start_address = GetLogicalAddress();
  current_voice = 0;
  source_driver = (uint)*arg_array;
  if (arg_count == 1) {
    target_smps2asm_version = 0;
  }
  else {
    target_smps2asm_version = *(uint *)(arg_array + 1);
    if (1 < target_smps2asm_version) {
      PrintError(
                "Error: Song targets a newer version of SMPS2ASM than what this tool supports (it wants version %d)\n"
                );
    }
  }
  if (undefined_symbol != (char *)0x0) {
    PrintError("Error: smpsHeaderStartSong must be evaluable on first pass\n");
    return;
  }
  return;
}

Assistant:

static void Macro_smpsHeaderStartSong(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	song_start_address = GetLogicalAddress();
	current_voice = 0;

	source_driver = arg_array[0];
	target_smps2asm_version = (arg_count >= 2) ? arg_array[1] : 0;

	if (target_smps2asm_version > SMPS2ASM_VERSION)
		PrintError("Error: Song targets a newer version of SMPS2ASM than what this tool supports (it wants version %d)\n", target_smps2asm_version);

	if (undefined_symbol)
		PrintError("Error: smpsHeaderStartSong must be evaluable on first pass\n");
}